

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lexer.cpp
# Opt level: O0

void test_unicode_escape_sequence_in_identifier(void)

{
  pointer *pptVar1;
  allocator<mjs::token> *paVar2;
  initializer_list<mjs::token> __l;
  initializer_list<mjs::token> __l_00;
  initializer_list<mjs::token> __l_01;
  bool bVar3;
  version vVar4;
  wostream *pwVar5;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar6;
  token *local_578;
  token *local_498;
  token *local_3b8;
  allocator<mjs::token> local_393;
  undefined1 local_392;
  allocator<wchar_t> local_391;
  wstring local_390;
  token *local_370;
  token local_368;
  iterator local_340;
  undefined1 local_338 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_2;
  undefined1 local_308 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_2;
  wstring local_2e8;
  token *local_2c8;
  token local_2c0;
  iterator local_298;
  undefined1 local_290 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r_1;
  undefined1 local_260 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l_1;
  allocator<wchar_t> local_231;
  wstring local_230;
  token *local_210;
  token local_208;
  iterator local_1e0;
  undefined1 local_1d8 [16];
  vector<mjs::token,_std::allocator<mjs::token>_> _r;
  undefined1 local_1a8 [8];
  vector<mjs::token,_std::allocator<mjs::token>_> _l;
  string local_180;
  wchar_t *local_160;
  wchar_t *uid;
  string local_148;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_128;
  string local_118;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_f8;
  string local_e8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_c8;
  string local_b8;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_98;
  string local_88;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_68;
  string local_58;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_38;
  string local_28;
  
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_38,L"\\u0069\\u0066");
  check_lex_fails_abi_cxx11_(&local_28,&local_38);
  std::__cxx11::string::~string((string *)&local_28);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_68,L"\\u0069\\u0000");
  check_lex_fails_abi_cxx11_(&local_58,&local_68);
  std::__cxx11::string::~string((string *)&local_58);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_98,L"\\u0069\\u00");
  check_lex_fails_abi_cxx11_(&local_88,&local_98);
  std::__cxx11::string::~string((string *)&local_88);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_c8,L"\\u0069\\u0");
  check_lex_fails_abi_cxx11_(&local_b8,&local_c8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_f8,L"\\u0069\\u");
  check_lex_fails_abi_cxx11_(&local_e8,&local_f8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_128,L"\\u0069\\");
  check_lex_fails_abi_cxx11_(&local_118,&local_128);
  std::__cxx11::string::~string((string *)&local_118);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&uid,L"\\u0069\\x66");
  check_lex_fails_abi_cxx11_(&local_148,(wstring_view *)&uid);
  std::__cxx11::string::~string((string *)&local_148);
  local_160 = L"\\u0073X\\u0031d";
  vVar4 = tested_version();
  if (vVar4 == es1) {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
               &_l.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,L"\\u0073X\\u0031d");
    check_lex_fails_abi_cxx11_
              (&local_180,
               (wstring_view *)
               &_l.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_180);
  }
  else {
    pptVar1 = &_r.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\\u0069");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a8,(wstring_view *)pptVar1);
    _l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._3_1_ = 1;
    local_210 = &local_208;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>((wstring *)&local_230,L"i",&local_231);
    mjs::token::token(&local_208,identifier,&local_230);
    _l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._3_1_ = 0;
    local_1e0 = &local_208;
    local_1d8._0_8_ = 1;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 2);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_01._M_len = local_1d8._0_8_;
    __l_01._M_array = local_1e0;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1d8 + 8),__l_01,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 2));
    local_3b8 = (token *)&local_1e0;
    do {
      local_3b8 = local_3b8 + -1;
      mjs::token::~token(local_3b8);
    } while (local_3b8 != &local_208);
    std::__cxx11::wstring::~wstring((wstring *)&local_230);
    std::allocator<wchar_t>::~allocator(&local_231);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a8,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1d8 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier")
      ;
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0xdc);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(LR\"(\\u0069)\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::identifier, L\"i\"})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a8);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1d8 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_1d8 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_1a8);
    pptVar1 = &_r_1.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\\u0073X\\u0031d"
              );
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_260,(wstring_view *)pptVar1);
    _l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._6_1_ = 1;
    local_2c8 = &local_2c0;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_2e8,L"sX1d",
               (allocator<wchar_t> *)
               ((long)&_l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    mjs::token::token(&local_2c0,identifier,&local_2e8);
    _l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage._6_1_ = 0;
    local_298 = &local_2c0;
    local_290._0_8_ = 1;
    paVar2 = (allocator<mjs::token> *)
             ((long)&_l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 5);
    std::allocator<mjs::token>::allocator(paVar2);
    __l_00._M_len = local_290._0_8_;
    __l_00._M_array = local_298;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_290 + 8),__l_00,paVar2);
    std::allocator<mjs::token>::~allocator
              ((allocator<mjs::token> *)
               ((long)&_l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 5));
    local_498 = (token *)&local_298;
    do {
      local_498 = local_498 + -1;
      mjs::token::~token(local_498);
    } while (local_498 != &local_2c0);
    std::__cxx11::wstring::~wstring((wstring *)&local_2e8);
    std::allocator<wchar_t>::~allocator
              ((allocator<wchar_t> *)
               ((long)&_l_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_260,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_290 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier")
      ;
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0xdd);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(uid)");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::identifier, L\"sX1d\"})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_260);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_290 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_290 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_260);
    pptVar1 = &_r_2.super__Vector_base<mjs::token,_std::allocator<mjs::token>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)pptVar1,L"\\u1234申");
    lex((vector<mjs::token,_std::allocator<mjs::token>_> *)local_308,(wstring_view *)pptVar1);
    local_392 = 1;
    local_370 = &local_368;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
              ((wstring *)&local_390,L"ሴ申",&local_391);
    mjs::token::token(&local_368,identifier,&local_390);
    local_392 = 0;
    local_340 = &local_368;
    local_338._0_8_ = 1;
    std::allocator<mjs::token>::allocator(&local_393);
    __l._M_len = local_338._0_8_;
    __l._M_array = local_340;
    std::vector<mjs::token,_std::allocator<mjs::token>_>::vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8),__l,&local_393);
    std::allocator<mjs::token>::~allocator(&local_393);
    local_578 = (token *)&local_340;
    do {
      local_578 = local_578 + -1;
      mjs::token::~token(local_578);
    } while (local_578 != &local_368);
    std::__cxx11::wstring::~wstring((wstring *)&local_390);
    std::allocator<wchar_t>::~allocator(&local_391);
    bVar3 = std::operator!=((vector<mjs::token,_std::allocator<mjs::token>_> *)local_308,
                            (vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8));
    if (bVar3) {
      pwVar5 = std::operator<<((wostream *)&std::wcerr,"test_unicode_escape_sequence_in_identifier")
      ;
      pwVar5 = std::operator<<(pwVar5," in ");
      pwVar5 = std::operator<<(pwVar5,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_lexer.cpp"
                              );
      pwVar5 = std::operator<<(pwVar5,":");
      pwVar5 = (wostream *)std::wostream::operator<<(pwVar5,0xde);
      pwVar5 = std::operator<<(pwVar5,":\n");
      pwVar5 = std::operator<<(pwVar5,"lex(L\"\\\\u1234\\x7533\")");
      pwVar5 = std::operator<<(pwVar5," != ");
      pwVar5 = std::operator<<(pwVar5,"TOKENS(token{token_type::identifier, L\"\\x1234\\x7533\"})");
      pwVar5 = std::operator<<(pwVar5,"\n");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)local_308);
      pwVar5 = std::operator<<(pbVar6," != ");
      pbVar6 = operator<<(pwVar5,(vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8))
      ;
      pwVar5 = std::operator<<(pbVar6,"\n");
      vVar4 = tested_version();
      pbVar6 = mjs::operator<<(pwVar5,vVar4);
      std::operator<<(pbVar6,"\n");
      abort();
    }
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)(local_338 + 8));
    std::vector<mjs::token,_std::allocator<mjs::token>_>::~vector
              ((vector<mjs::token,_std::allocator<mjs::token>_> *)local_308);
  }
  return;
}

Assistant:

void test_unicode_escape_sequence_in_identifier() {
    check_lex_fails(LR"(\u0069\u0066)"); // Must not spell 'if' like this
    check_lex_fails(LR"(\u0069\u0000)");
    check_lex_fails(LR"(\u0069\u00)");
    check_lex_fails(LR"(\u0069\u0)");
    check_lex_fails(LR"(\u0069\u)");
    check_lex_fails(LR"(\u0069\)");
    check_lex_fails(LR"(\u0069\x66)");

    const auto uid = LR"(\u0073X\u0031d)";
    if (tested_version() == version::es1) {
        check_lex_fails(uid);
    } else {
        SIMPLE_TEST(LR"(\u0069)", ID("i"));
        SIMPLE_TEST(uid, ID("sX1d"));
        SIMPLE_TEST(L"\\u1234\x7533", ID("\x1234\x7533"));
    }
}